

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbusplatformmenu.cpp
# Opt level: O3

void __thiscall
QDBusPlatformMenu::insertMenuItem
          (QDBusPlatformMenu *this,QPlatformMenuItem *menuItem,QPlatformMenuItem *before)

{
  long lVar1;
  QPodArrayOps<QDBusPlatformMenuItem*> *this_00;
  long *plVar2;
  QArrayData *pQVar3;
  QDBusPlatformMenuItem *pQVar4;
  undefined8 uVar5;
  long lVar6;
  undefined8 *puVar7;
  uint uVar8;
  long in_FS_OFFSET;
  unsigned_long_long copy;
  QDBusPlatformMenuItem *item;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined8 uStack_4c;
  undefined4 local_44;
  char *local_40;
  QDebug local_38;
  QDBusPlatformMenuItem *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  uVar8 = 0xffffffff;
  if (*(long *)(this + 0x58) != 0) {
    lVar6 = -8;
    do {
      if (*(long *)(this + 0x58) * -8 + lVar6 == -8) goto LAB_006405fd;
      lVar1 = lVar6 + 8;
      plVar2 = (long *)(*(long *)(this + 0x50) + 8 + lVar6);
      lVar6 = lVar1;
    } while ((QPlatformMenuItem *)*plVar2 != before);
    uVar8 = (uint)(lVar1 >> 3);
  }
LAB_006405fd:
  local_30 = (QDBusPlatformMenuItem *)menuItem;
  QtPrivateLogging::qLcMenu();
  if (((byte)QtPrivateLogging::qLcMenu::category.field_2.bools.enabledDebug._q_value._M_base._M_i &
      1) != 0) {
    local_58 = 2;
    uStack_54 = 0;
    uStack_50 = 0;
    uStack_4c = 0;
    local_44 = 0;
    local_40 = QtPrivateLogging::qLcMenu::category.name;
    QMessageLogger::debug();
    QTextStream::operator<<(&(local_38.stream)->ts,(int)*(short *)((long)&menuItem[2].m_tag + 2));
    if ((local_38.stream)->space == true) {
      QTextStream::operator<<(&(local_38.stream)->ts,' ');
    }
    pQVar3 = *(QArrayData **)(menuItem + 1);
    puVar7 = *(undefined8 **)&menuItem[1].field_0x8;
    if (pQVar3 != (QArrayData *)0x0) {
      LOCK();
      (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    if (puVar7 == (undefined8 *)0x0) {
      puVar7 = &QString::_empty;
    }
    QDebug::putString((QChar *)&local_38,(ulong)puVar7);
    if ((local_38.stream)->space == true) {
      QTextStream::operator<<(&(local_38.stream)->ts,' ');
    }
    if (pQVar3 != (QArrayData *)0x0) {
      LOCK();
      (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar3,2,0x10);
      }
    }
    QDebug::~QDebug(&local_38);
  }
  pQVar4 = local_30;
  this_00 = (QPodArrayOps<QDBusPlatformMenuItem*> *)(this + 0x48);
  local_58 = SUB84(local_30,0);
  uStack_54 = (undefined4)((ulong)local_30 >> 0x20);
  if ((int)uVar8 < 0) {
    QtPrivate::QPodArrayOps<QDBusPlatformMenuItem*>::emplace<QDBusPlatformMenuItem*&>
              (this_00,*(qsizetype *)(this + 0x58),(QDBusPlatformMenuItem **)&local_58);
    QList<QDBusPlatformMenuItem_*>::end((QList<QDBusPlatformMenuItem_*> *)this_00);
  }
  else {
    QtPrivate::QPodArrayOps<QDBusPlatformMenuItem*>::emplace<QDBusPlatformMenuItem*&>
              (this_00,(ulong)(uVar8 & 0x7fffffff),(QDBusPlatformMenuItem **)&local_58);
    QList<QDBusPlatformMenuItem_*>::begin((QList<QDBusPlatformMenuItem_*> *)this_00);
  }
  uVar5 = (**(code **)(*(long *)&pQVar4->super_QPlatformMenuItem + 0x68))(pQVar4);
  local_58 = (undefined4)uVar5;
  uStack_54 = (undefined4)((ulong)uVar5 >> 0x20);
  QHash<unsigned_long_long,QDBusPlatformMenuItem*>::emplace<QDBusPlatformMenuItem*const&>
            ((QHash<unsigned_long_long,QDBusPlatformMenuItem*> *)(this + 0x40),
             (unsigned_long_long *)&local_58,&local_30);
  if ((QDBusPlatformMenu *)local_30->m_subMenu != (QDBusPlatformMenu *)0x0) {
    syncSubMenu(this,(QDBusPlatformMenu *)local_30->m_subMenu);
  }
  emitUpdated(this);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDBusPlatformMenu::insertMenuItem(QPlatformMenuItem *menuItem, QPlatformMenuItem *before)
{
    QDBusPlatformMenuItem *item = static_cast<QDBusPlatformMenuItem *>(menuItem);
    QDBusPlatformMenuItem *beforeItem = static_cast<QDBusPlatformMenuItem *>(before);
    int idx = m_items.indexOf(beforeItem);
    qCDebug(qLcMenu) << item->dbusID() << item->text();
    if (idx < 0)
        m_items.append(item);
    else
        m_items.insert(idx, item);
    m_itemsByTag.insert(item->tag(), item);
    if (item->menu())
        syncSubMenu(static_cast<const QDBusPlatformMenu *>(item->menu()));
    emitUpdated();
}